

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_stream_stop(cubeb_stream_conflict1 *stm)

{
  int iVar1;
  cubeb_stream_conflict1 *in_RDI;
  int r_1;
  int r;
  cubeb_conflict1 *ctx;
  cubeb_stream_conflict1 *stm_00;
  int local_4;
  
  if (in_RDI == (cubeb_stream_conflict1 *)0x0) {
    __assert_fail("stm",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x52e,"int alsa_stream_stop(cubeb_stream *)");
  }
  stm_00 = (cubeb_stream_conflict1 *)in_RDI->context;
  if (((in_RDI->stream_type != SND_PCM_STREAM_PLAYBACK) ||
      (in_RDI->other_stream == (cubeb_stream_conflict1 *)0x0)) ||
     (local_4 = alsa_stream_stop(stm_00), local_4 == 0)) {
    pthread_mutex_lock((pthread_mutex_t *)((long)&stm_00->mutex + 8));
    while (in_RDI->state == PROCESSING) {
      iVar1 = pthread_cond_wait((pthread_cond_t *)&in_RDI->cond,
                                (pthread_mutex_t *)((long)&stm_00->mutex + 8));
      if (iVar1 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                      ,0x53a,"int alsa_stream_stop(cubeb_stream *)");
      }
    }
    alsa_set_stream_state(in_RDI,(stream_state)((ulong)stm_00 >> 0x20));
    pthread_mutex_unlock((pthread_mutex_t *)((long)&stm_00->mutex + 8));
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->mutex);
    (*cubeb_snd_pcm_pause)(in_RDI->pcm,1);
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->mutex);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
alsa_stream_stop(cubeb_stream * stm)
{
  cubeb * ctx;
  int r;

  assert(stm);
  ctx = stm->context;

  if (stm->stream_type == SND_PCM_STREAM_PLAYBACK && stm->other_stream) {
    int r = alsa_stream_stop(stm->other_stream);
    if (r != CUBEB_OK)
      return r;
  }

  pthread_mutex_lock(&ctx->mutex);
  while (stm->state == PROCESSING) {
    r = pthread_cond_wait(&stm->cond, &ctx->mutex);
    assert(r == 0);
  }

  alsa_set_stream_state(stm, INACTIVE);
  pthread_mutex_unlock(&ctx->mutex);

  pthread_mutex_lock(&stm->mutex);
  WRAP(snd_pcm_pause)(stm->pcm, 1);
  pthread_mutex_unlock(&stm->mutex);

  return CUBEB_OK;
}